

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManLevelNum(Gia_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar7;
  ulong extraout_RDX;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Gia_Obj_t *pObj;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  iVar7 = 0;
  if ((0 < p->nObjs) && (pObj = p->pObjs, pObj != (Gia_Obj_t *)0x0)) {
    lVar10 = 1;
    lVar9 = 0;
    uVar8 = extraout_RDX;
    do {
      uVar2 = *(ulong *)pObj;
      uVar5 = (uint)uVar2;
      if ((int)uVar5 < 0) {
LAB_00744e64:
        if ((uVar2 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
          if ((int)uVar5 < 0 && (int)(uVar2 & 0x1fffffff) != 0x1fffffff) {
            Gia_ObjSetCoLevel(p,pObj);
            iVar7 = extraout_EDX_01;
          }
          else {
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,(int)lVar10,(int)CONCAT71((int7)(uVar8 >> 8),(int)uVar5 < 0));
            if ((long)pVVar4->nSize <= lVar10 + -1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[lVar10 + -1] = 0;
            iVar7 = extraout_EDX_02;
          }
        }
        else {
          Gia_ObjSetGateLevel(p,pObj);
          iVar7 = extraout_EDX_00;
        }
      }
      else {
        uVar8 = 0x1fffffff;
        if (((uVar5 & 0x1fffffff) == 0x1fffffff) ||
           (uVar6 = (uint)(uVar2 >> 0x20) & 0x1fffffff, uVar8 = (ulong)uVar6,
           (uVar5 & 0x1fffffff) != uVar6)) goto LAB_00744e64;
        Gia_ObjSetBufLevel(p,pObj);
        iVar7 = extraout_EDX;
      }
      pGVar3 = p->pObjs;
      if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = p->nLevels;
      uVar5 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,uVar5 + 1,iVar7);
      if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[uVar5 & 0x7fffffff];
      if (pVVar4->pArray[uVar5 & 0x7fffffff] < iVar1) {
        iVar7 = iVar1;
      }
      p->nLevels = iVar7;
      if (p->nObjs <= lVar10) {
        return iVar7;
      }
      lVar9 = lVar9 + 1;
      uVar8 = lVar9 * 3;
      pObj = p->pObjs + lVar9;
      lVar10 = lVar10 + 1;
    } while (p->pObjs != (Gia_Obj_t *)0x0);
  }
  return iVar7;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}